

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O1

int lws_plat_if_up(char *ifname,int fd,int up)

{
  int iVar1;
  char *format;
  ifreq ifr;
  char local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_28 = 0;
  lws_strncpy(local_48,ifname,0x10);
  iVar1 = ioctl(fd,0x8913,local_48);
  if (iVar1 < 0) {
    format = "%s: SIOCGIFFLAGS fail\n";
  }
  else {
    local_38 = CONCAT62(local_38._2_6_,(ushort)(up != 0) | (ushort)local_38 & 0xfffe);
    iVar1 = ioctl(fd,0x8914);
    if (-1 < iVar1) {
      return 0;
    }
    format = "%s: SIOCSIFFLAGS fail\n";
  }
  _lws_log(1,format,"lws_plat_if_up");
  return 1;
}

Assistant:

int
lws_plat_if_up(const char *ifname, int fd, int up)
{
#if defined(__linux__)
	struct ifreq ifr;

	memset(&ifr, 0, sizeof(ifr));
	lws_strncpy(ifr.ifr_name, ifname, IFNAMSIZ);

	if (ioctl(fd, SIOCGIFFLAGS, &ifr) < 0) {
		lwsl_err("%s: SIOCGIFFLAGS fail\n", __func__);
		return 1;
	}

	if (up)
		ifr.ifr_flags |= IFF_UP;
	else
		ifr.ifr_flags &= ~IFF_UP;

	if (ioctl(fd, SIOCSIFFLAGS, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFFLAGS fail\n", __func__);
		return 1;
	}

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}